

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ByteCodeWriter.cpp
# Opt level: O3

void __thiscall
Js::ByteCodeWriter::ElementScopedU(ByteCodeWriter *this,OpCode op,PropertyIdIndexType index)

{
  code *pcVar1;
  bool bVar2;
  undefined4 *puVar3;
  PropertyIdIndexType local_2c [2];
  OpLayoutT_ElementScopedU<Js::LayoutSizePolicy<(Js::LayoutSize)2>_> layout;
  
  CheckOpen(this);
  CheckOp(this,op,(OpLayoutType)0x44);
  bVar2 = OpCodeAttr::HasMultiSizeLayout(op);
  if (!bVar2) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar3 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
    *puVar3 = 1;
    bVar2 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/ByteCode/ByteCodeWriter.cpp"
                                ,0x73e,"(OpCodeAttr::HasMultiSizeLayout(op))",
                                "OpCodeAttr::HasMultiSizeLayout(op)");
    if (!bVar2) {
      pcVar1 = (code *)invalidInstructionException();
      (*pcVar1)();
    }
    *puVar3 = 0;
  }
  bVar2 = TryWriteElementScopedU<Js::LayoutSizePolicy<(Js::LayoutSize)0>>(this,op,index);
  if (!bVar2) {
    bVar2 = TryWriteElementScopedU<Js::LayoutSizePolicy<(Js::LayoutSize)1>>(this,op,index);
    if (!bVar2) {
      local_2c[0] = index;
      Data::EncodeT<(Js::LayoutSize)2>(&this->m_byteCodeData,op,this);
      Data::Write(&this->m_byteCodeData,local_2c,4);
    }
  }
  return;
}

Assistant:

void ByteCodeWriter::ElementScopedU(OpCode op, PropertyIdIndexType index)
    {
        CheckOpen();
        CheckOp(op, OpLayoutType::ElementScopedU);
        Assert(OpCodeAttr::HasMultiSizeLayout(op));

        MULTISIZE_LAYOUT_WRITE(ElementScopedU, op, index);
    }